

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLsSetup(ARKodeMem ark_mem,int convfail,sunrealtype tpred,N_Vector ypred,N_Vector fpred,
              int *jcurPtr,N_Vector vtemp1,N_Vector vtemp2,N_Vector vtemp3)

{
  ARKLsMem pAVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  int line;
  SUNMatrix p_Var5;
  char *msgfmt;
  int dgamma_fail;
  sunrealtype gamma;
  ARKLsMem arkls_mem;
  int *jcur;
  sunrealtype gamrat;
  
  arkls_mem = (ARKLsMem)0x0;
  iVar2 = arkLs_AccessLMem(ark_mem,"arkLsSetup",&arkls_mem);
  pAVar1 = arkls_mem;
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = SUNLinSolGetType(arkls_mem->LS);
  if (iVar2 == 3) {
    pAVar1->last_flag = 0;
    return 0;
  }
  pAVar1->tcur = tpred;
  pAVar1->ycur = ypred;
  pAVar1->fcur = fpred;
  iVar2 = (*ark_mem->step_getgammas)(ark_mem,&gamma,&gamrat,&jcur,&dgamma_fail);
  pAVar1->last_flag = iVar2;
  if (iVar2 == 0) {
    uVar3 = 1;
    if (((ark_mem->initsetup == 0) && (ark_mem->nst < pAVar1->msbj + pAVar1->nstlj)) &&
       ((convfail != 1 || (dgamma_fail != 0)))) {
      uVar3 = (uint)(convfail == 2);
    }
    pAVar1->jbad = uVar3;
    if ((ark_mem->step_getmassmem == (ARKTimestepGetMassMemFn)0x0) ||
       (pvVar4 = (*ark_mem->step_getmassmem)(ark_mem), pvVar4 == (void *)0x0)) {
      p_Var5 = (SUNMatrix)0x0;
    }
    else {
      p_Var5 = *(SUNMatrix *)((long)pvVar4 + 0x10);
      iVar2 = arkLsMassSetup(ark_mem,tpred,vtemp1,vtemp2,vtemp3);
      pAVar1->last_flag = iVar2;
      if (iVar2 != 0) {
        msgfmt = "Error setting up mass-matrix linear solver";
        iVar2 = -0xb;
        line = 0xc9a;
        goto LAB_0013f4d2;
      }
    }
    if (pAVar1->A == (SUNMatrix)0x0) {
      *jcurPtr = pAVar1->jbad;
      p_Var5 = (SUNMatrix)0x0;
    }
    else {
      iVar2 = (*pAVar1->linsys)(tpred,ypred,fpred,pAVar1->A,p_Var5,SUB14(pAVar1->jbad == 0,0),
                                jcurPtr,gamma,pAVar1->A_data,vtemp1,vtemp2,vtemp3);
      if (*jcurPtr != 0) {
        pAVar1->nje = pAVar1->nje + 1;
        pAVar1->nstlj = ark_mem->nst;
        pAVar1->tnlj = tpred;
      }
      if (iVar2 != 0) {
        if (pAVar1->user_linsys == 0) {
          return iVar2;
        }
        if (-1 < iVar2) {
          pAVar1->last_flag = -8;
          return 1;
        }
        arkProcessError(ark_mem,-7,0xcb7,"arkLsSetup",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                        ,"The Jacobian routine failed in an unrecoverable manner.");
        pAVar1->last_flag = -7;
        return -1;
      }
      p_Var5 = pAVar1->A;
    }
    iVar2 = SUNLinSolSetup(pAVar1->LS,p_Var5);
    pAVar1->last_flag = iVar2;
    if (pAVar1->A != (SUNMatrix)0x0) {
      return iVar2;
    }
    if (*jcurPtr != 0) {
      pAVar1->npe = pAVar1->npe + 1;
      pAVar1->nstlj = ark_mem->nst;
      pAVar1->tnlj = tpred;
    }
    if (pAVar1->jbad == 0) {
      return iVar2;
    }
    *jcurPtr = 1;
  }
  else {
    msgfmt = "An error occurred in ark_step_getgammas";
    line = 0xc7d;
LAB_0013f4d2:
    arkProcessError(ark_mem,iVar2,line,"arkLsSetup",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,msgfmt);
  }
  return pAVar1->last_flag;
}

Assistant:

int arkLsSetup(ARKodeMem ark_mem, int convfail, sunrealtype tpred,
               N_Vector ypred, N_Vector fpred, sunbooleantype* jcurPtr,
               N_Vector vtemp1, N_Vector vtemp2, N_Vector vtemp3)
{
  ARKLsMem arkls_mem     = NULL;
  void* ark_step_massmem = NULL;
  SUNMatrix M            = NULL;
  sunrealtype gamma, gamrat;
  sunbooleantype dgamma_fail, *jcur;
  int retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Immediately return when using matrix-embedded linear solver */
  if (SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
  {
    arkls_mem->last_flag = ARKLS_SUCCESS;
    return (arkls_mem->last_flag);
  }

  /* Set ARKLs time and N_Vector pointers to current time,
     solution and rhs */
  arkls_mem->tcur = tpred;
  arkls_mem->ycur = ypred;
  arkls_mem->fcur = fpred;

  /* get gamma values from time step module */
  arkls_mem->last_flag = ark_mem->step_getgammas(ark_mem, &gamma, &gamrat,
                                                 &jcur, &dgamma_fail);
  if (arkls_mem->last_flag)
  {
    arkProcessError(ark_mem, arkls_mem->last_flag, __LINE__, __func__, __FILE__,
                    "An error occurred in ark_step_getgammas");
    return (arkls_mem->last_flag);
  }

  /* Use initsetup, gamma/gammap, and convfail to set J/P eval. flag jok;
     Note: the "ARK_FAIL_BAD_J" test is asking whether the nonlinear
     solver converged due to a bad system Jacobian AND our gamma was
     fine, indicating that the J and/or P were invalid */
  arkls_mem->jbad = (ark_mem->initsetup) ||
                    (ark_mem->nst >= arkls_mem->nstlj + arkls_mem->msbj) ||
                    ((convfail == ARK_FAIL_BAD_J) && (!dgamma_fail)) ||
                    (convfail == ARK_FAIL_OTHER);

  /* Check for mass matrix module and setup mass matrix */
  if (ark_mem->step_getmassmem)
  {
    ark_step_massmem = ark_mem->step_getmassmem(ark_mem);
  }

  if (ark_step_massmem)
  {
    /* Set shortcut to the mass matrix (NULL if matrix-free) */
    M = ((ARKLsMassMem)ark_step_massmem)->M;

    /* Setup mass matrix linear solver (including recomputation of mass matrix) */
    arkls_mem->last_flag = arkLsMassSetup(ark_mem, tpred, vtemp1, vtemp2, vtemp3);
    if (arkls_mem->last_flag)
    {
      arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, __LINE__, __func__, __FILE__,
                      "Error setting up mass-matrix linear solver");
      return (arkls_mem->last_flag);
    }
  }

  /* Setup the linear system if necessary */
  if (arkls_mem->A != NULL)
  {
    /* Update J if appropriate and evaluate A = I-gamma*J or A = M-gamma*J */
    retval = arkls_mem->linsys(tpred, ypred, fpred, arkls_mem->A, M,
                               !(arkls_mem->jbad), jcurPtr, gamma,
                               arkls_mem->A_data, vtemp1, vtemp2, vtemp3);

    /* Update J eval count and step when J was last updated */
    if (*jcurPtr)
    {
      arkls_mem->nje++;
      arkls_mem->nstlj = ark_mem->nst;
      arkls_mem->tnlj  = tpred;
    }

    /* Check linsys() return value and return if necessary */
    if (retval != ARKLS_SUCCESS)
    {
      if (arkls_mem->user_linsys)
      {
        if (retval < 0)
        {
          arkProcessError(ark_mem, ARKLS_JACFUNC_UNRECVR, __LINE__, __func__,
                          __FILE__, MSG_LS_JACFUNC_FAILED);
          arkls_mem->last_flag = ARKLS_JACFUNC_UNRECVR;
          return (-1);
        }
        else
        {
          arkls_mem->last_flag = ARKLS_JACFUNC_RECVR;
          return (1);
        }
      }
      else { return (retval); }
    }
  }
  else
  {
    /* Matrix-free case, set jcur to jbad */
    *jcurPtr = arkls_mem->jbad;
  }

  /* Call LS setup routine -- the LS may call arkLsPSetup, who will
     pass the heuristic suggestions above to the user code(s) */
  arkls_mem->last_flag = SUNLinSolSetup(arkls_mem->LS, arkls_mem->A);

  /* If the SUNMatrix was NULL, update heuristics flags */
  if (arkls_mem->A == NULL)
  {
    /* If user set jcur to SUNTRUE, increment npe and save nst value */
    if (*jcurPtr)
    {
      arkls_mem->npe++;
      arkls_mem->nstlj = ark_mem->nst;
      arkls_mem->tnlj  = tpred;
    }

    /* Update jcurPtr flag if we suggested an update */
    if (arkls_mem->jbad) { *jcurPtr = SUNTRUE; }
  }

  return (arkls_mem->last_flag);
}